

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O2

void __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::~ThreeAxisForceTorqueContactSensor
          (ThreeAxisForceTorqueContactSensor *this)

{
  ThreeAxisForceTorqueContactSensorPrivateAttributes *this_00;
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__ThreeAxisForceTorqueContactSensor_001e6b58;
  this_00 = this->pimpl;
  if (this_00 != (ThreeAxisForceTorqueContactSensorPrivateAttributes *)0x0) {
    ThreeAxisForceTorqueContactSensorPrivateAttributes::
    ~ThreeAxisForceTorqueContactSensorPrivateAttributes(this_00);
  }
  operator_delete(this_00,0xc0);
  LinkSensor::~LinkSensor(&this->super_LinkSensor);
  return;
}

Assistant:

ThreeAxisForceTorqueContactSensor::~ThreeAxisForceTorqueContactSensor()
{
    delete this->pimpl;
}